

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastSqrt(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int iVar1;
  int *piVar2;
  Gia_Man_t *p;
  uint *puVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int *ps;
  uint *puVar12;
  int Carry;
  uint local_8c;
  Gia_Man_t *local_88;
  Vec_Int_t *local_80;
  ulong local_78;
  uint *local_70;
  ulong local_68;
  long local_60;
  int *local_58;
  ulong local_50;
  long local_48;
  uint *local_40;
  ulong local_38;
  
  local_8c = 0xffffffff;
  local_88 = pNew;
  local_58 = pNum;
  if ((nNum & 1U) != 0) {
    __assert_fail("nNum % 2 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x254,"void Wlc_BlastSqrt(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  uVar9 = nNum >> 1;
  if (vRes->nCap < (int)uVar9) {
    if (vRes->pArray == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar5 = (int *)realloc(vRes->pArray,(long)(int)uVar9 << 2);
    }
    vRes->pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_003058ac;
    vRes->nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset(vRes->pArray,0,(ulong)uVar9 * 4);
  }
  vRes->nSize = uVar9;
  uVar6 = nNum * 2;
  if (SBORROW4(vTmp->nCap,uVar6) != vTmp->nCap + nNum * -2 < 0) {
    if (vTmp->pArray == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar6 << 2);
    }
    else {
      piVar5 = (int *)realloc(vTmp->pArray,(long)(int)uVar6 << 2);
    }
    vTmp->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_003058ac:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTmp->nCap = uVar6;
  }
  local_80 = vRes;
  if (0 < nNum) {
    memset(vTmp->pArray,0,(ulong)uVar6 << 2);
  }
  vTmp->nSize = uVar6;
  if (0 < (int)uVar9) {
    local_40 = (uint *)local_80->pArray;
    piVar2 = vTmp->pArray;
    local_60 = (long)nNum;
    piVar5 = piVar2 + local_60;
    local_78 = 3;
    local_48 = 1;
    uVar10 = 0;
    local_70 = local_40;
    local_68 = (ulong)uVar9;
    do {
      puVar12 = local_40 + 1;
      lVar8 = local_60 + uVar10 * -2;
      *piVar5 = local_58[lVar8 + -2];
      piVar5[1] = local_58[lVar8 + -1];
      lVar8 = 0;
      do {
        piVar5[lVar8 + 2] = piVar2[lVar8];
        lVar8 = lVar8 + 1;
      } while (local_48 != lVar8);
      local_50 = uVar10 + 1;
      local_38 = uVar10 + 2;
      uVar11 = 0;
      ps = piVar2;
      local_40 = puVar12;
      do {
        if (uVar11 < local_38 && 1 < uVar11) {
          uVar9 = *puVar12;
          if ((int)uVar9 < 0) goto LAB_0030586e;
          iVar4 = piVar5[uVar11];
          uVar6 = local_8c;
        }
        else {
          uVar9 = 1;
          if (uVar11 != 0) {
            uVar9 = local_8c;
          }
          if ((int)uVar9 < 0) goto LAB_0030586e;
          iVar4 = piVar5[uVar11];
          uVar6 = 1;
        }
        Wlc_BlastFullAdder(local_88,iVar4,uVar9 ^ 1,uVar6,(int *)&local_8c,ps);
        puVar3 = local_70;
        p = local_88;
        if (uVar10 <= (int)uVar11 - 1) {
          if ((int)local_8c < 0) goto LAB_0030586e;
          local_8c = local_8c ^ 1;
        }
        uVar11 = uVar11 + 1;
        ps = ps + 1;
        puVar12 = puVar12 + -1;
      } while (local_78 != uVar11);
      if ((int)local_8c < 0) {
LAB_0030586e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf4,"int Abc_LitNot(int)");
      }
      local_70[uVar10] = local_8c ^ 1;
      uVar11 = 0;
      do {
        iVar4 = Gia_ManHashMux(p,puVar3[uVar10],piVar2[uVar11],piVar5[uVar11]);
        piVar2[uVar11] = iVar4;
        uVar11 = uVar11 + 1;
      } while (local_78 != uVar11);
      local_48 = local_48 + 1;
      local_78 = local_78 + 1;
      uVar10 = local_50;
    } while (local_50 != local_68);
  }
  iVar4 = local_80->nSize;
  if (1 < iVar4) {
    piVar5 = local_80->pArray;
    iVar7 = -1;
    lVar8 = 0;
    do {
      iVar1 = piVar5[lVar8];
      piVar5[lVar8] = piVar5[iVar4 + iVar7];
      piVar5[local_80->nSize + iVar7] = iVar1;
      lVar8 = lVar8 + 1;
      iVar4 = local_80->nSize;
      iVar7 = iVar7 + -1;
    } while (lVar8 < iVar4 / 2);
  }
  return;
}

Assistant:

void Wlc_BlastSqrt( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pRes, * pSum, * pSumP;
    int i, k, Carry = -1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pRes = Vec_IntArray( vRes );
    pSum = Vec_IntArray( vTmp );
    pSumP = pSum + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        pSumP[0] = pNum[nNum-2*i-2];
        pSumP[1] = pNum[nNum-2*i-1];
        for ( k = 0; k < i+1; k++ )
            pSumP[k+2] = pSum[k];
        for ( k = 0; k < i + 3; k++ )
        {
            if ( k >= 2 && k < i + 2 ) // middle ones
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(pRes[i-k+1]), Carry, &Carry, &pSum[k] );
            else
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(k ? Carry:1), 1,     &Carry, &pSum[k] );
            if ( k == 0 || k > i )
                Carry = Abc_LitNot(Carry);
        }
        pRes[i] = Abc_LitNot(Carry);
        for ( k = 0; k < i + 3; k++ )
            pSum[k] = Gia_ManHashMux( pNew, pRes[i], pSum[k], pSumP[k] );
    }
    Vec_IntReverseOrder( vRes );
}